

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

int parse_entry(char *buff,entry *entry_i)

{
  ucs4_t *puVar1;
  ucs4_t *puVar2;
  ucs4_t **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  
  sVar9 = 4;
  sVar6 = 0;
  while( true ) {
    if (buff[sVar6] == '\0') {
      return -1;
    }
    if (buff[sVar6] == '\t') break;
    sVar6 = sVar6 + 1;
    sVar9 = sVar9 + 4;
  }
  puVar1 = utf8_to_ucs4(buff,sVar6);
  if (puVar1 != (ucs4_t *)0xffffffffffffffff) {
    pcVar8 = buff + sVar6;
    puVar2 = (ucs4_t *)malloc(sVar9);
    entry_i->key = puVar2;
    ucs4cpy(puVar2,puVar1);
    free(puVar1);
    ppuVar3 = (ucs4_t **)malloc(0x2000);
    entry_i->value = ppuVar3;
    uVar7 = 0;
    uVar4 = 0x400;
    while( true ) {
      if ((*pcVar8 == '\0') || (*pcVar8 == '\n')) {
        ppuVar3 = (ucs4_t **)realloc(entry_i->value,uVar4 << 3);
        entry_i->value = ppuVar3;
        ppuVar3[uVar7] = (ucs4_t *)0x0;
        return 0;
      }
      uVar5 = uVar4;
      if (uVar4 <= uVar7) {
        uVar5 = uVar4 * 2;
        ppuVar3 = (ucs4_t **)realloc(entry_i->value,uVar4 << 4);
        entry_i->value = ppuVar3;
      }
      pcVar8 = pcVar8 + 1;
      sVar9 = 4;
      sVar6 = 0;
      while ((0x20 < (ulong)(byte)pcVar8[sVar6] ||
             ((0x100000401U >> ((ulong)(byte)pcVar8[sVar6] & 0x3f) & 1) == 0))) {
        sVar6 = sVar6 + 1;
        sVar9 = sVar9 + 4;
      }
      puVar1 = utf8_to_ucs4(pcVar8,sVar6);
      if (puVar1 == (ucs4_t *)0xffffffffffffffff) break;
      pcVar8 = pcVar8 + sVar6;
      puVar2 = (ucs4_t *)malloc(sVar9);
      entry_i->value[uVar7] = puVar2;
      ucs4cpy(entry_i->value[uVar7],puVar1);
      free(puVar1);
      uVar7 = uVar7 + 1;
      uVar4 = uVar5;
    }
    if (-1 < (long)(uVar7 - 1)) {
      do {
        free(entry_i->value[uVar7 - 1]);
        uVar7 = uVar7 - 1;
      } while (0 < (long)uVar7);
    }
    free(entry_i->value);
    free(entry_i->key);
    return -1;
  }
  return -1;
}

Assistant:

int parse_entry(const char * buff, entry * entry_i)
{
	size_t length;
	const char * pbuff;

	/* 解析鍵 */
	for (pbuff = buff; *pbuff != '\t' && *pbuff != '\0'; ++ pbuff)
		;
	if (*pbuff == '\0')
		return -1;
	length = pbuff - buff;

	ucs4_t * ucs4_buff;
	ucs4_buff = utf8_to_ucs4(buff, length);
	if (ucs4_buff == (ucs4_t *) -1)
		return -1;
	entry_i->key = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
	ucs4cpy(entry_i->key, ucs4_buff);
	free(ucs4_buff);

	/* 解析值 */
	size_t value_i, value_count = INITIAL_DICTIONARY_SIZE;
	entry_i->value = (ucs4_t **) malloc(value_count * sizeof (ucs4_t *));

	for (value_i = 0; *pbuff != '\0' && *pbuff != '\n'; ++ value_i)
	{
		if (value_i >= value_count)
		{
			value_count += value_count;
			entry_i->value = (ucs4_t **) realloc(
					entry_i->value,
					value_count * sizeof (ucs4_t *)
			);
		}

		for (buff = ++ pbuff; *pbuff != ' ' && *pbuff != '\0' && *pbuff != '\n'; ++ pbuff)
			;
		length = pbuff - buff;
		ucs4_buff = utf8_to_ucs4(buff, length);
		if (ucs4_buff == (ucs4_t *) -1)
		{
			/* 發生錯誤 回退內存申請 */
			ssize_t i;
			for (i = value_i - 1; i >= 0; -- i)
				free(entry_i->value[i]);
			free(entry_i->value);
			free(entry_i->key);
			return -1;
		}

		entry_i->value[value_i] = (ucs4_t *) malloc((length + 1) * sizeof(ucs4_t));
		ucs4cpy(entry_i->value[value_i], ucs4_buff);
		free(ucs4_buff);
	}

	entry_i->value = (ucs4_t **) realloc(
			entry_i->value,
			value_count * sizeof (ucs4_t *)
	);
	entry_i->value[value_i] = NULL;

	return 0;
}